

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pac_type.cc
# Opt level: O3

void __thiscall Type::GenBufferConfiguration(Type *this,Output *out_cc,Env *env)

{
  int iVar1;
  uint uVar2;
  char *pcVar3;
  char *pcVar4;
  string frame_buffer_arg;
  undefined1 *local_70;
  char *local_68;
  undefined1 local_60;
  undefined7 uStack_5f;
  string local_50;
  
  local_68 = (char *)0x0;
  local_60 = 0;
  local_70 = &local_60;
  iVar1 = (*(this->super_DataDepElement)._vptr_DataDepElement[0x16])();
  if (iVar1 == 2) {
    if (this->incremental_input_ != true) goto LAB_0012681f;
    iVar1 = (*(this->super_DataDepElement)._vptr_DataDepElement[0x16])(this);
    if ((iVar1 != 3) &&
       ((iVar1 != 2 ||
        ((this->attr_length_expr_ == (Expr *)0x0 && ((this->attr_restofflow_ & 1U) == 0))))))
    goto LAB_0012681f;
    pcVar3 = Env::RValue(env,buffering_state_id);
    Output::println(out_cc,"if ( %s == 0 )",pcVar3);
    out_cc->indent_ = out_cc->indent_ + 1;
    Output::println(out_cc,"{");
    if (this->attr_length_expr_ == (Expr *)0x0) {
      if (this->attr_restofflow_ == true) {
        std::__cxx11::string::_M_replace((ulong)&local_70,0,local_68,0x1337ff);
      }
    }
    else {
      uVar2 = Expr::MinimalHeaderSize(this->attr_length_expr_,this->env_);
      strfmt_abi_cxx11_(&local_50,"%d",(ulong)uVar2);
      std::__cxx11::string::operator=((string *)&local_70,(string *)&local_50);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
    }
    pcVar3 = Env::LValue(env,flow_buffer_id);
    pcVar4 = "false";
    if (this->attr_chunked_ != false) {
      pcVar4 = "true";
    }
    Output::println(out_cc,"%s->NewFrame(%s, %s);",pcVar3,local_70,pcVar4);
    pcVar3 = Env::LValue(env,buffering_state_id);
    Output::println(out_cc,"%s = 1;",pcVar3);
    Output::println(out_cc,"}");
  }
  else {
    if (iVar1 != 3) goto LAB_0012681f;
    pcVar3 = Env::RValue(env,buffering_state_id);
    Output::println(out_cc,"if ( %s == 0 )",pcVar3);
    out_cc->indent_ = out_cc->indent_ + 1;
    Output::println(out_cc,"{");
    if (this->attr_linebreaker_ == (Expr *)0x0) {
      pcVar3 = Env::LValue(env,flow_buffer_id);
      Output::println(out_cc,"%s->UnsetLineBreaker();",pcVar3);
    }
    else {
      pcVar3 = Env::LValue(env,flow_buffer_id);
      Output::println(out_cc,"%s->SetLineBreaker((unsigned char*)%s);",pcVar3,
                      (this->attr_linebreaker_->orig_)._M_dataplus._M_p);
    }
    pcVar3 = Env::LValue(env,flow_buffer_id);
    Output::println(out_cc,"%s->NewLine();",pcVar3);
    pcVar3 = Env::LValue(env,buffering_state_id);
    Output::println(out_cc,"%s = 1;",pcVar3);
    Output::println(out_cc,"}");
  }
  out_cc->indent_ = out_cc->indent_ + -1;
LAB_0012681f:
  if (local_70 != &local_60) {
    operator_delete(local_70,CONCAT71(uStack_5f,local_60) + 1);
  }
  return;
}

Assistant:

void Type::GenBufferConfiguration(Output* out_cc, Env* env)
	{
	ASSERT(buffer_input());

	string frame_buffer_arg;

	switch ( buffer_mode() )
		{
		case BUFFER_NOTHING:
			break;

		case BUFFER_BY_LENGTH:
			if ( ! NeedsBufferingStateVar() )
				break;

			ASSERT(env->GetDataType(buffering_state_id));
			out_cc->println("if ( %s == 0 )", env->RValue(buffering_state_id));
			out_cc->inc_indent();
			out_cc->println("{");

			if ( attr_length_expr_ )
				{
				// frame_buffer_arg = attr_length_expr_->EvalExpr(out_cc, env);
				frame_buffer_arg = strfmt("%d", InitialBufferLength());
				}
			else if ( attr_restofflow_ )
				{
				ASSERT(attr_chunked());
				frame_buffer_arg = "-1";
				}
			else
				{
				ASSERT(0);
				}

			out_cc->println("%s->NewFrame(%s, %s);", env->LValue(flow_buffer_id),
			                frame_buffer_arg.c_str(), attr_chunked() ? "true" : "false");

			out_cc->println("%s = 1;", env->LValue(buffering_state_id));
			out_cc->println("}");
			out_cc->dec_indent();
			break;

		case BUFFER_BY_LINE:
			ASSERT(env->GetDataType(buffering_state_id));
			out_cc->println("if ( %s == 0 )", env->RValue(buffering_state_id));
			out_cc->inc_indent();
			out_cc->println("{");

			if ( BufferableWithLineBreaker() )
				out_cc->println("%s->SetLineBreaker((unsigned char*)%s);",
				                env->LValue(flow_buffer_id), LineBreaker()->orig());
			else
				out_cc->println("%s->UnsetLineBreaker();", env->LValue(flow_buffer_id));

			out_cc->println("%s->NewLine();", env->LValue(flow_buffer_id));

			out_cc->println("%s = 1;", env->LValue(buffering_state_id));
			out_cc->println("}");
			out_cc->dec_indent();
			break;

		default:
			ASSERT(0);
			break;
		}
	}